

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O1

int optimize_meshfile(map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                      *nodes_map,
                     map<int,_node_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_node_duplication_data>_>_>
                     *node_duplicated_data_map,
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *materials_map,
                     map<int,_material_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_material_duplication_data>_>_>
                     *duplicated_material_data_map)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  iterator __position;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  long *plVar9;
  iterator __position_00;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Self __tmp;
  _Self __tmp_8;
  int iVar12;
  _Self __tmp_2;
  bool bVar13;
  string file_output_name;
  string logf_print_buffer;
  ofstream log_file;
  _Base_ptr local_2a0;
  pair<int,_material_duplication_data> local_294;
  _Rb_tree<int,std::pair<int_const,material_duplication_data>,std::_Select1st<std::pair<int_const,material_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,material_duplication_data>>>
  *local_288;
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  *local_280;
  _Rb_tree<int,std::pair<int_const,node_duplication_data>,std::_Select1st<std::pair<int_const,node_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,node_duplication_data>>>
  *local_278;
  long *local_270 [2];
  long local_260 [2];
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_288 = (_Rb_tree<int,std::pair<int_const,material_duplication_data>,std::_Select1st<std::pair<int_const,material_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,material_duplication_data>>>
               *)duplicated_material_data_map;
  local_280 = (_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
               *)materials_map;
  local_278 = (_Rb_tree<int,std::pair<int_const,node_duplication_data>,std::_Select1st<std::pair<int_const,node_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,node_duplication_data>>>
               *)node_duplicated_data_map;
  std::ofstream::ofstream(&local_230);
  p_Var5 = (nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(nodes_map->_M_t)._M_impl.super__Rb_tree_header;
  p_Var3 = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
  local_250 = &local_240;
  local_248 = 0;
  local_240 = 0;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"logfile.txt","");
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)local_270);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"================== Mesh Duplication Reduction ===============\n"
             ,0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"--------------------- Original Nodes List -------------------\n"
             ,0x3e);
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,p_Var5[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": [",3);
      poVar4 = std::ostream::_M_insert<double>((double)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<double>((double)p_Var5[1]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<double>((double)p_Var5[1]._M_right);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  p_Var7 = (nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var7 != p_Var3) {
    iVar12 = 0;
    do {
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      while ((_Rb_tree_header *)__position._M_node != p_Var1) {
        if (((((double)p_Var7[1]._M_parent != (double)__position._M_node[1]._M_parent) ||
             (NAN((double)p_Var7[1]._M_parent) || NAN((double)__position._M_node[1]._M_parent))) ||
            ((double)p_Var7[1]._M_left != (double)__position._M_node[1]._M_left)) ||
           (((NAN((double)p_Var7[1]._M_left) || NAN((double)__position._M_node[1]._M_left) ||
             ((double)p_Var7[1]._M_right != (double)__position._M_node[1]._M_right)) ||
            (NAN((double)p_Var7[1]._M_right) || NAN((double)__position._M_node[1]._M_right))))) {
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
        else {
          iVar12 = iVar12 + 1;
          local_294.second.duplicated_material_ID = __position._M_node[1]._M_color;
          local_294.second.original_material_ID = p_Var7[1]._M_color;
          local_294.first = iVar12;
          std::
          _Rb_tree<int,std::pair<int_const,node_duplication_data>,std::_Select1st<std::pair<int_const,node_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,node_duplication_data>>>
          ::_M_emplace_unique<std::pair<int,node_duplication_data>>
                    (local_278,(pair<int,_node_duplication_data> *)&local_294);
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<int,std::pair<int_const,co_ordinates>,std::_Select1st<std::pair<int_const,co_ordinates>>,std::less<int>,std::allocator<std::pair<int_const,co_ordinates>>>
          ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,co_ordinates>,std::_Select1st<std::pair<int_const,co_ordinates>>,std::less<int>,std::allocator<std::pair<int_const,co_ordinates>>>
                              *)nodes_map,__position);
          bVar13 = __position._M_node == p_Var3;
          __position._M_node = p_Var6;
          if (bVar13) {
            p_Var3 = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
          }
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != p_Var3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"--------------------- Updated Nodes List --------------------\n"
             ,0x3e);
  p_Var5 = (nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,p_Var5[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": [",3);
      poVar4 = std::ostream::_M_insert<double>((double)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<double>((double)p_Var5[1]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<double>((double)p_Var5[1]._M_right);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"---------------------- Duplicated Nodes ---------------------\n"
             ,0x3e);
  p_Var5 = *(_Rb_tree_node_base **)(local_278 + 0x18);
  p_Var8 = (_Rb_tree_node_base *)(local_278 + 8);
  if (p_Var5 != p_Var8) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Original:  ",0xb);
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)&local_230,*(int *)&p_Var5[1].field_0x4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    Duplicate:  ",0x10);
      plVar9 = (long *)std::ostream::operator<<((ostream *)poVar4,*(int *)&p_Var5[1]._M_parent);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != p_Var8);
  }
  p_Var10 = *(_Base_ptr *)(local_280 + 0x18);
  p_Var5 = (_Rb_tree_node_base *)(local_280 + 8);
  local_2a0 = (_Base_ptr)std::_Rb_tree_decrement(p_Var5);
  if (p_Var10 != local_2a0) {
    iVar12 = 0;
    do {
      __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      if (__position_00._M_node != p_Var5) {
        do {
          iVar2 = std::__cxx11::string::compare((string *)&p_Var10[1]._M_parent);
          if (iVar2 == 0) {
            iVar12 = iVar12 + 1;
            local_294.second.duplicated_material_ID = __position_00._M_node[1]._M_color;
            local_294.second.original_material_ID = p_Var10[1]._M_color;
            local_294.first = iVar12;
            std::
            _Rb_tree<int,std::pair<int_const,material_duplication_data>,std::_Select1st<std::pair<int_const,material_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,material_duplication_data>>>
            ::_M_emplace_unique<std::pair<int,material_duplication_data>>(local_288,&local_294);
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(__position_00._M_node);
            std::
            _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
            ::erase_abi_cxx11_(local_280,__position_00);
            bVar13 = __position_00._M_node == local_2a0;
            __position_00._M_node = p_Var8;
            if (bVar13) {
              local_2a0 = (_Base_ptr)std::_Rb_tree_decrement(p_Var5);
            }
          }
          else {
            __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
          }
        } while (__position_00._M_node != p_Var5);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_2a0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"------------------- Duplicated Materials -------------------\n",
             0x3d);
  p_Var10 = *(_Base_ptr *)(local_288 + 0x18);
  p_Var11 = (_Base_ptr)(local_288 + 8);
  if (p_Var10 != p_Var11) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Original:  ",0xb);
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)&local_230,*(int *)&p_Var10[1].field_0x4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    Duplicate:  ",0x10);
      plVar9 = (long *)std::ostream::operator<<((ostream *)poVar4,*(int *)&p_Var10[1]._M_parent);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var11);
  }
  std::ofstream::close();
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_split_cmpts;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return 0;
}

Assistant:

int optimize_meshfile(  std::map<int, co_ordinates> &nodes_map,
                        std::map<int, node_duplication_data> &node_duplicated_data_map,
                        std::map<int, std::string> &materials_map,
                        std::map<int, material_duplication_data> &duplicated_material_data_map   )
{
    int exit_status = EXIT_FAILURE;
    int duplicates_counter = 0;
    std::ofstream log_file;
    std::map<int, co_ordinates>::iterator main_iterator = nodes_map.begin();
    std::map<int, co_ordinates>::iterator limit = --nodes_map.end();

    std::string logf_print_buffer;
    std::string file_output_name = "logfile.txt";
    log_file.open( file_output_name, std::ios::out | std::ios::app );
    log_file << "================== Mesh Duplication Reduction ===============\n";
    // Display the original node data
    log_file << "--------------------- Original Nodes List -------------------\n";
    while(main_iterator!=nodes_map.end())
    {
        log_file << main_iterator->first
        << ": ["<< main_iterator->second.co_ord[0] << ", "
        << main_iterator->second.co_ord[1] << ", "
        << main_iterator->second.co_ord[2] << "]\n";
        main_iterator++;
    }
    main_iterator = nodes_map.begin();
    // ------------------------------ Node duplication remover --------------------
    while(main_iterator != limit)
    {
        std::map<int, co_ordinates>::iterator nested_iterator = main_iterator;
        nested_iterator++;
        while(nested_iterator != nodes_map.end())
        {
            //compare with next
            if(co_ord_compare( main_iterator->second, nested_iterator->second ) == true)
            {
                // add co-ords to dupe data map
                node_duplication_data duplication;
                duplication.original_node = main_iterator->first;
                duplication.duplicated_node = nested_iterator->first;
                node_duplicated_data_map.insert(std::pair<int, node_duplication_data>(++duplicates_counter, duplication));
                //delete the duplicate
                std::map<int, co_ordinates>::iterator holder_iterator = nested_iterator;
                nested_iterator++;
                nodes_map.erase(holder_iterator);
                if (holder_iterator==limit)
                    limit = --nodes_map.end();
            }
            else
            {
                nested_iterator++;
            }
        }
        main_iterator++;
    }
    //print nodes map
    log_file << "--------------------- Updated Nodes List --------------------\n";
    main_iterator=nodes_map.begin();
    while(main_iterator != nodes_map.end())
    {
        log_file << main_iterator->first
        << ": ["
        << main_iterator->second.co_ord[0]
        << ", "
        << main_iterator->second.co_ord[1]
        << ", "
        << main_iterator->second.co_ord[2]
        << "]"
        << std::endl;
        main_iterator++;
    }
    //print dupe list
    log_file << "---------------------- Duplicated Nodes ---------------------\n";
    std::map<int, node_duplication_data>::iterator dupe_iterator = node_duplicated_data_map.begin();
    while (dupe_iterator != node_duplicated_data_map.end())
    {
        log_file << "Original:  " << dupe_iterator->second.original_node <<"    Duplicate:  " << dupe_iterator->second.duplicated_node << std::endl;
        dupe_iterator++;
    }
    // Material duplication remover ---------------------------------------------------------------------------------------
    std::map<int, std::string>::iterator material_iterator = materials_map.begin();
    int material_duplicates_counter = 0;
    std::map<int, std::string>::iterator materials_map_limit = --materials_map.end();
    while(material_iterator != materials_map_limit)
    {
        std::map<int, std::string>::iterator nested_material_iterator = material_iterator;
        nested_material_iterator++;
        while (nested_material_iterator != materials_map.end())
        {
            if (material_compare(material_iterator, nested_material_iterator) == true)
            {
                material_duplication_data identified_material_duplication;
                identified_material_duplication.original_material_ID = material_iterator->first;
                identified_material_duplication.duplicated_material_ID = nested_material_iterator->first;
                duplicated_material_data_map.insert(
                std::pair<int, material_duplication_data>(++material_duplicates_counter, identified_material_duplication));
                //delete the duplicate
                std::map<int, std::string>::iterator material_holder_iterator = nested_material_iterator;
                nested_material_iterator++;
                materials_map.erase(material_holder_iterator);
                if(material_holder_iterator==materials_map_limit)
                    materials_map_limit = --materials_map.end();
            }
            else
            {
                nested_material_iterator++;
            }
        }
        material_iterator++;
    }
    // Print duplication list of materials for DEBUG purposes
    log_file <<  "------------------- Duplicated Materials -------------------\n";
    std::map<int, material_duplication_data>::iterator material_dupe_iterator = duplicated_material_data_map.begin();
    while (material_dupe_iterator != duplicated_material_data_map.end())
    {
        log_file << "Original:  " << material_dupe_iterator->second.original_material_ID
        <<"    Duplicate:  " << material_dupe_iterator->second.duplicated_material_ID << std::endl;
        material_dupe_iterator++;
    }

    // end material duplication remover ------------------------------------------------------------------------------------
    exit_status = EXIT_SUCCESS;
    log_file.close();
    return exit_status;
}